

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::mark_as_packable(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  ulong uVar5;
  
  while (uVar2 = (ulong)(type->parent_type).id, uVar2 != 0) {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar2);
  }
  if (type->basetype == Struct) {
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,
                       SPIRVCrossDecorationBufferBlockRepacked);
    if (!bVar1) {
      Compiler::set_extended_decoration
                ((Compiler *)this,(type->super_IVariant).self.id,
                 SPIRVCrossDecorationBufferBlockRepacked,0);
      uVar2 = (ulong)(uint)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          pSVar3 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              (type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                              [uVar5].id);
          mark_as_packable(this,pSVar3);
          uVar4 = (ulong)(pSVar3->type_alias).id;
          if (uVar4 != 0) {
            pSVar3 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + uVar4);
            mark_as_packable(this,pSVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_as_packable(SPIRType &type)
{
	// If this is not the base type (eg. it's a pointer or array), tunnel down
	if (type.parent_type)
	{
		mark_as_packable(get<SPIRType>(type.parent_type));
		return;
	}

	// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
	if (type.basetype == SPIRType::Struct && !has_extended_decoration(type.self, SPIRVCrossDecorationBufferBlockRepacked))
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationBufferBlockRepacked);

		// Recurse
		uint32_t mbr_cnt = uint32_t(type.member_types.size());
		for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
		{
			uint32_t mbr_type_id = type.member_types[mbr_idx];
			auto &mbr_type = get<SPIRType>(mbr_type_id);
			mark_as_packable(mbr_type);
			if (mbr_type.type_alias)
			{
				auto &mbr_type_alias = get<SPIRType>(mbr_type.type_alias);
				mark_as_packable(mbr_type_alias);
			}
		}
	}
}